

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  wostream *pwVar2;
  ostream *poVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *unaff_R13;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  wstring test34;
  string compressStr;
  wstring decompressWStr;
  wstring input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test;
  wstring compressWStr;
  string decompressStr;
  LZString encoder;
  wstring local_198;
  string local_178;
  wchar_t *local_158;
  long local_150;
  wchar_t local_148;
  undefined4 uStack_144;
  wstring local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  wstring local_100;
  wstring local_e0;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  LZString local_a0;
  
  if (argc != 2) {
    return 0;
  }
  lzstring::LZString::LZString(&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,argv[1],(allocator<char> *)&local_100);
  lzstring::to_wstring(&local_138,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = L'\0';
  local_c0 = &local_b0;
  local_b8 = 0;
  local_b0 = 0;
  local_150 = 0;
  local_148 = L'\0';
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_158 = &local_148;
  pwVar2 = std::operator<<((wostream *)&std::wcout,"str: ");
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar2,local_138._M_dataplus._M_p,local_138._M_string_length);
  plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
  if (plVar1 == (long *)0x0) {
LAB_0010afef:
    std::__throw_bad_cast();
  }
  else {
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar2);
    std::wostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[base64]",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    lzstring::LZString::CompressToBase64((string *)&local_198,&local_a0,&local_138);
    std::__cxx11::string::operator=((string *)&local_178,(string *)&local_198);
    unaff_R13 = &local_198.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_198._M_dataplus._M_p != unaff_R13) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    lzstring::LZString::DeCompressFromBase64(&local_198,&local_a0,&local_178);
    std::__cxx11::wstring::operator=((wstring *)&local_158,(wstring *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_198._M_dataplus._M_p != unaff_R13) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity * 4 + 4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compress: ",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_178._M_dataplus._M_p,local_178._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pwVar2 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,local_158,local_150);
    plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
    if (plVar1 == (long *)0x0) goto LAB_0010afef;
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar2);
    std::wostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"origin size: ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Compress size: ",0xf);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rate: ",6);
    auVar7._8_4_ = (int)(local_178._M_string_length >> 0x20);
    auVar7._0_8_ = local_178._M_string_length;
    auVar7._12_4_ = 0x45300000;
    auVar8._8_4_ = (int)(local_138._M_string_length >> 0x20);
    auVar8._0_8_ = local_138._M_string_length;
    auVar8._12_4_ = 0x45300000;
    poVar3 = std::ostream::_M_insert<double>
                       (((auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_178._M_string_length) -
                        4503599627370496.0)) /
                        ((auVar8._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_138._M_string_length) -
                        4503599627370496.0)));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------------",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[URI]",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    lzstring::LZString::CompressToEncodedURIComponent((string *)&local_198,&local_a0,&local_138);
    std::__cxx11::string::operator=((string *)&local_178,(string *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_198._M_dataplus._M_p != unaff_R13) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    lzstring::LZString::DeCompressFromEncodedURIComponent(&local_198,&local_a0,&local_178);
    std::__cxx11::wstring::operator=((wstring *)&local_158,(wstring *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_198._M_dataplus._M_p != unaff_R13) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity * 4 + 4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compress: ",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_178._M_dataplus._M_p,local_178._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pwVar2 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,local_158,local_150);
    plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
    if (plVar1 == (long *)0x0) goto LAB_0010afef;
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar2);
    std::wostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"origin size: ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Compress size: ",0xf);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rate: ",6);
    auVar9._8_4_ = (int)(local_178._M_string_length >> 0x20);
    auVar9._0_8_ = local_178._M_string_length;
    auVar9._12_4_ = 0x45300000;
    auVar10._8_4_ = (int)(local_138._M_string_length >> 0x20);
    auVar10._0_8_ = local_138._M_string_length;
    auVar10._12_4_ = 0x45300000;
    poVar3 = std::ostream::_M_insert<double>
                       (((auVar9._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_178._M_string_length) -
                        4503599627370496.0)) /
                        ((auVar10._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_138._M_string_length) -
                        4503599627370496.0)));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------------",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[UTF16]",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    lzstring::LZString::CompressToUTF16(&local_198,&local_a0,&local_138);
    std::__cxx11::wstring::operator=((wstring *)&local_100,(wstring *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_198._M_dataplus._M_p != unaff_R13) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity * 4 + 4);
    }
    lzstring::LZString::DeCompressFromUTF16(&local_198,&local_a0,&local_100);
    std::__cxx11::wstring::operator=((wstring *)&local_158,(wstring *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_198._M_dataplus._M_p != unaff_R13) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity * 4 + 4);
    }
    pwVar2 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,local_158,local_150);
    plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
    if (plVar1 == (long *)0x0) goto LAB_0010afef;
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar2);
    std::wostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"origin size: ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Compress size: ",0xf);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rate: ",6);
    auVar11._8_4_ = (int)(local_100._M_string_length >> 0x20);
    auVar11._0_8_ = local_100._M_string_length;
    auVar11._12_4_ = 0x45300000;
    auVar12._8_4_ = (int)(local_138._M_string_length >> 0x20);
    auVar12._0_8_ = local_138._M_string_length;
    auVar12._12_4_ = 0x45300000;
    poVar3 = std::ostream::_M_insert<double>
                       (((auVar11._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_100._M_string_length) -
                        4503599627370496.0)) /
                        ((auVar12._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_138._M_string_length) -
                        4503599627370496.0)));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------------",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[LZ String]",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    lzstring::LZString::Compress(&local_198,&local_a0,&local_138);
    std::__cxx11::wstring::operator=((wstring *)&local_100,(wstring *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_198._M_dataplus._M_p != unaff_R13) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity * 4 + 4);
    }
    lzstring::LZString::DeCompress(&local_198,&local_a0,&local_100);
    std::__cxx11::wstring::operator=((wstring *)&local_158,(wstring *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_198._M_dataplus._M_p != unaff_R13) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity * 4 + 4);
    }
    pwVar2 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,local_158,local_150);
    plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
    if (plVar1 == (long *)0x0) goto LAB_0010afef;
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar2);
    std::wostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"origin size: ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Compress size: ",0xf);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rate: ",6);
    auVar13._8_4_ = (int)(local_100._M_string_length >> 0x20);
    auVar13._0_8_ = local_100._M_string_length;
    auVar13._12_4_ = 0x45300000;
    auVar14._8_4_ = (int)(local_138._M_string_length >> 0x20);
    auVar14._0_8_ = local_138._M_string_length;
    auVar14._12_4_ = 0x45300000;
    poVar3 = std::ostream::_M_insert<double>
                       (((auVar13._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_100._M_string_length) -
                        4503599627370496.0)) /
                        ((auVar14._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_138._M_string_length) -
                        4503599627370496.0)));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------------",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[LZ String uint8 array]",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lzstring::LZString::CompressToUint8Array(&local_a0,&local_138,&local_118);
    lzstring::LZString::DeCompressFromUint8Array_abi_cxx11_(&local_198,&local_a0,&local_118);
    std::__cxx11::wstring::operator=((wstring *)&local_158,(wstring *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_198._M_dataplus._M_p != unaff_R13) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity * 4 + 4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compress: ",10);
    if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar6 = 0;
      do {
        poVar3 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            (uint)local_118.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar6]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)local_118.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_118.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start));
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    pwVar2 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,local_158,local_150);
    plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x50))(plVar1,10);
      std::wostream::put((wchar_t)pwVar2);
      std::wostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"origin size: ",0xd);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Compress size: ",0xf);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rate: ",6);
      lVar4 = (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      auVar15._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar15._0_8_ = lVar4;
      auVar15._12_4_ = 0x45300000;
      auVar16._8_4_ = (int)(local_138._M_string_length >> 0x20);
      auVar16._0_8_ = local_138._M_string_length;
      auVar16._12_4_ = 0x45300000;
      poVar3 = std::ostream::_M_insert<double>
                         (((auVar15._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) /
                          ((auVar16._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_138._M_string_length) -
                          4503599627370496.0)));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"-------------------------------------------",0x2b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      local_198._M_dataplus._M_p = (pointer)unaff_R13;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_198,L"😘",L"");
      lzstring::LZString::CompressToBase64((string *)&local_e0,&local_a0,&local_198);
      std::__cxx11::string::operator=((string *)&local_178,(string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      lzstring::LZString::DeCompressFromBase64(&local_e0,&local_a0,&local_178);
      std::__cxx11::wstring::operator=((wstring *)&local_158,(wstring *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity * 4 + 4);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_178._M_dataplus._M_p,
                          local_178._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         ((wostream *)&std::wcout,local_158,local_150);
      plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x50))(plVar1,10);
        std::wostream::put((wchar_t)pwVar2);
        std::wostream::flush();
        system("PAUSE");
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_198._M_dataplus._M_p != unaff_R13) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_118.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_158 != &local_148) {
          operator_delete(local_158,CONCAT44(uStack_144,local_148) * 4 + 4);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT44(local_100.field_2._M_local_buf[1],
                                   local_100.field_2._M_local_buf[0]) * 4 + 4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,
                          CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                   local_178.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        lzstring::LZString::~LZString(&local_a0);
        return 0;
      }
      goto LAB_0010aff9;
    }
  }
  std::__throw_bad_cast();
LAB_0010aff9:
  uVar5 = std::__throw_bad_cast();
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_198._M_dataplus._M_p != unaff_R13) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,CONCAT44(uStack_144,local_148) * 4 + 4);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT44(local_100.field_2._M_local_buf[1],local_100.field_2._M_local_buf[0]) *
                    4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity * 4 + 4);
  }
  lzstring::LZString::~LZString(&local_a0);
  _Unwind_Resume(uVar5);
}

Assistant:

int main(int argc, char *argv[])
{
  if (argc == 2)
  {
    lzstring::LZString encoder;
    std::wstring input(lzstring::to_wstring(argv[1]));
    std::string compressStr;
    std::wstring compressWStr;
    std::string decompressStr;
    std::wstring decompressWStr;

    std::wcout << "str: " << input << std::endl;

    std::cout << "[base64]" << std::endl;
    compressStr = encoder.CompressToBase64(input);
    decompressWStr = encoder.DeCompressFromBase64(compressStr);
    std::cout << "compress: " << compressStr << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << compressStr.size() << std::endl;
    std::cout << "rate: " << (double(compressStr.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::cout << "[URI]" << std::endl;
    compressStr = encoder.CompressToEncodedURIComponent(input);
    decompressWStr = encoder.DeCompressFromEncodedURIComponent(compressStr);
    std::cout << "compress: " << compressStr << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << compressStr.size() << std::endl;
    std::cout << "rate: " << (double(compressStr.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::cout << "[UTF16]" << std::endl;
    compressWStr = encoder.CompressToUTF16(input);
    decompressWStr = encoder.DeCompressFromUTF16(compressWStr);
    //std::wcout << "compress: " << compressWStr << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << compressWStr.size() << std::endl;
    std::cout << "rate: " << (double(compressWStr.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::cout << "[LZ String]" << std::endl;
    compressWStr = encoder.Compress(input);
    decompressWStr = encoder.DeCompress(compressWStr);
    //std::wcout << "compress: " << compressWStr << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << compressWStr.size() << std::endl;
    std::cout << "rate: " << (double(compressWStr.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::cout << "[LZ String uint8 array]" << std::endl;
    std::vector<uint8_t> test;
    encoder.CompressToUint8Array(input, test);
    decompressWStr = encoder.DeCompressFromUint8Array(test);
    std::cout << "compress: ";
    for (size_t i = 0; i < test.size(); i++)
    {
      std::cout << (int)test[i] << " ";
    }
    std::cout << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << test.size() << std::endl;
    std::cout << "rate: " << (double(test.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::wstring test34 = L"😘";
    compressStr = encoder.CompressToBase64(test34);
    decompressWStr = encoder.DeCompressFromBase64(compressStr);
    std::cout << compressStr << std::endl;
    std::wcout << decompressWStr << std::endl;
    system("PAUSE");
  }
}